

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall bssl::der::Parser::ReadTag(Parser *this,CBS_ASN1_TAG tag,Input *out)

{
  bool bVar1;
  undefined1 local_40 [8];
  Input value;
  CBS_ASN1_TAG actual_tag;
  Input *out_local;
  CBS_ASN1_TAG tag_local;
  Parser *this_local;
  
  Input::Input((Input *)local_40);
  bVar1 = PeekTagAndValue(this,(CBS_ASN1_TAG *)((long)&value.data_.size_ + 4),(Input *)local_40);
  if ((bVar1) && (value.data_.size_._4_4_ == tag)) {
    bVar1 = Advance(this);
    if (!bVar1) {
      abort();
    }
    (out->data_).data_ = (uchar *)local_40;
    (out->data_).size_ = (size_t)value.data_.data_;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ReadTag(CBS_ASN1_TAG tag, Input *out) {
  CBS_ASN1_TAG actual_tag;
  Input value;
  if (!PeekTagAndValue(&actual_tag, &value) || actual_tag != tag) {
    return false;
  }
  BSSL_CHECK(Advance());
  *out = value;
  return true;
}